

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_prespch_buf.c
# Opt level: O2

void fe_prespch_free(prespch_buf_t *prespch_buf)

{
  if (prespch_buf != (prespch_buf_t *)0x0) {
    if (prespch_buf->cep_buf != (mfcc_t **)0x0) {
      ckd_free_2d(prespch_buf->cep_buf);
    }
    if (prespch_buf->pcm_buf != (int16 *)0x0) {
      ckd_free(prespch_buf->pcm_buf);
    }
    ckd_free(prespch_buf);
    return;
  }
  return;
}

Assistant:

void
fe_prespch_free(prespch_buf_t * prespch_buf)
{
    if (!prespch_buf)
	return;
    if (prespch_buf->cep_buf)
        ckd_free_2d((void **) prespch_buf->cep_buf);
    if (prespch_buf->pcm_buf)
        ckd_free(prespch_buf->pcm_buf);
    ckd_free(prespch_buf);
}